

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
Service_AddNodes_existing
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_NodeId *parentNodeId,
          UA_NodeId *referenceTypeId,UA_NodeId *typeDefinition,
          UA_InstantiationCallback *instantiationCallback,UA_NodeId *addedNodeId)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  UA_NodeClass UVar9;
  uint uVar10;
  UA_SecureChannel *pUVar11;
  UA_NodeStoreEntry *pUVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  size_t sVar16;
  UA_Boolean UVar17;
  UA_StatusCode UVar18;
  UA_NodeStoreEntry **ppUVar19;
  long lVar20;
  undefined1 deleteReferences;
  ulong uVar21;
  UA_AddReferencesItem *item;
  char *pcVar22;
  ulong uVar23;
  UA_Logger p_Var24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  UA_NodeStore *ns;
  ulong uVar32;
  undefined1 auStack_138 [8];
  UA_NodeId subtypeId;
  undefined1 local_b0 [8];
  UA_NodeId id_1;
  UA_NodeId basedatavariabletype;
  UA_NodeId baseobjecttype;
  ContinuationPointList local_50;
  ulong local_48;
  UA_ListOfUASubscriptions local_40;
  UA_PublishResponseEntry *local_38;
  
  if (server->namespacesSize <= (ulong)(node->nodeId).namespaceIndex) {
    pUVar11 = session->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Namespace invalid"
                ,uVar21,uVar25,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7]);
    UA_NodeStore_deleteNode(node);
    return 0x80330000;
  }
  UVar9 = node->nodeClass;
  if (((UVar9 == UA_NODECLASS_OBJECT) && (UVar17 = UA_NodeId_isNull(parentNodeId), UVar17)) &&
     (UVar17 = UA_NodeId_isNull(referenceTypeId), UVar17)) {
    ns = server->nodestore;
    goto LAB_0011fe97;
  }
  ns = server->nodestore;
  ppUVar19 = findNode(ns,parentNodeId);
  if (ppUVar19 == (UA_NodeStoreEntry **)0x0) {
    p_Var24 = (server->config).logger;
    pUVar11 = session->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    uVar10 = (session->sessionId).identifier.numeric;
    local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
    uVar8 = (session->sessionId).identifier.guid.data3;
    local_50.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[0];
    bVar1 = (session->sessionId).identifier.guid.data4[1];
    bVar2 = (session->sessionId).identifier.guid.data4[2];
    bVar3 = (session->sessionId).identifier.guid.data4[3];
    bVar4 = (session->sessionId).identifier.guid.data4[4];
    bVar5 = (session->sessionId).identifier.guid.data4[5];
    bVar6 = (session->sessionId).identifier.guid.data4[6];
    bVar7 = (session->sessionId).identifier.guid.data4[7];
    pcVar22 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Parent node not found"
    ;
LAB_001201d6:
    local_38 = (UA_PublishResponseEntry *)(ulong)uVar8;
    local_40.lh_first._2_6_ = 0;
    local_48 = (ulong)bVar1;
    local_50.lh_first._1_7_ = 0;
    UA_LOG_INFO(p_Var24,UA_LOGCATEGORY_SESSION,pcVar22,uVar21,uVar25,(ulong)uVar10,local_40.lh_first
                ,local_38,local_50.lh_first,local_48,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,
                (ulong)bVar5,(ulong)bVar6,(ulong)bVar7);
    UVar18 = 0x805b0000;
    goto LAB_001207e4;
  }
  pUVar12 = *ppUVar19;
  ppUVar19 = findNode(ns,referenceTypeId);
  if (ppUVar19 == (UA_NodeStoreEntry **)0x0) {
    p_Var24 = (server->config).logger;
    pUVar11 = session->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    uVar26 = (ulong)(session->sessionId).identifier.numeric;
    local_40.lh_first = (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data2;
    local_38 = (UA_PublishResponseEntry *)(ulong)(session->sessionId).identifier.guid.data3;
    local_50.lh_first =
         (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[0];
    local_48 = (ulong)(session->sessionId).identifier.guid.data4[1];
    uVar29 = (ulong)(session->sessionId).identifier.guid.data4[2];
    uVar30 = (ulong)(session->sessionId).identifier.guid.data4[3];
    uVar27 = (ulong)(session->sessionId).identifier.guid.data4[4];
    uVar28 = (ulong)(session->sessionId).identifier.guid.data4[5];
    uVar23 = (ulong)(session->sessionId).identifier.guid.data4[6];
    uVar32 = (ulong)(session->sessionId).identifier.guid.data4[7];
    pcVar22 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent not found"
    ;
  }
  else {
    if (((*ppUVar19)->node).nodeClass == UA_NODECLASS_REFERENCETYPE) {
      if (*(char *)&(*ppUVar19)[1].orig == '\x01') {
        p_Var24 = (server->config).logger;
        pUVar11 = session->channel;
        if (pUVar11 == (UA_SecureChannel *)0x0) {
          uVar21 = 0;
          uVar25 = 0;
        }
        else {
          if (pUVar11->connection == (UA_Connection *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
          }
          uVar25 = (ulong)(pUVar11->securityToken).channelId;
        }
        uVar10 = (session->sessionId).identifier.numeric;
        local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
        uVar8 = (session->sessionId).identifier.guid.data3;
        local_50.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[0];
        bVar7 = (session->sessionId).identifier.guid.data4[1];
        bVar6 = (session->sessionId).identifier.guid.data4[2];
        bVar5 = (session->sessionId).identifier.guid.data4[3];
        bVar1 = (session->sessionId).identifier.guid.data4[4];
        bVar4 = (session->sessionId).identifier.guid.data4[5];
        bVar3 = (session->sessionId).identifier.guid.data4[6];
        bVar2 = (session->sessionId).identifier.guid.data4[7];
        pcVar22 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Abstract reference type to the parent not allowed"
        ;
LAB_001207b7:
        local_38 = (UA_PublishResponseEntry *)(ulong)uVar8;
        local_40.lh_first._2_6_ = 0;
        local_48 = (ulong)bVar7;
        local_50.lh_first._1_7_ = 0;
        UA_LOG_INFO(p_Var24,UA_LOGCATEGORY_SESSION,pcVar22,uVar21,uVar25,(ulong)uVar10,
                    local_40.lh_first,local_38,local_50.lh_first,local_48,(ulong)bVar6,(ulong)bVar5,
                    (ulong)bVar1,(ulong)bVar4,(ulong)bVar3,(ulong)bVar2);
        UVar18 = 0x805c0000;
        goto LAB_001207e4;
      }
      auStack_138._0_2_ = 0;
      auStack_138._4_4_ = UA_NODEIDTYPE_NUMERIC;
      subtypeId.namespaceIndex = 0x2d;
      subtypeId._2_2_ = 0;
      uVar10 = UVar9 - UA_NODECLASS_OBJECTTYPE >> 3;
      if (((UVar9 << 0x1d | uVar10) < 8) && ((0x8bU >> (uVar10 & 0x1f) & 1) != 0)) {
        UVar17 = UA_NodeId_equal(referenceTypeId,(UA_NodeId *)auStack_138);
        if (!UVar17) {
          p_Var24 = (server->config).logger;
          pUVar11 = session->channel;
          if (pUVar11 == (UA_SecureChannel *)0x0) {
            uVar21 = 0;
            uVar25 = 0;
          }
          else {
            if (pUVar11->connection == (UA_Connection *)0x0) {
              uVar21 = 0;
            }
            else {
              uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
            }
            uVar25 = (ulong)(pUVar11->securityToken).channelId;
          }
          uVar10 = (session->sessionId).identifier.numeric;
          local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
          uVar8 = (session->sessionId).identifier.guid.data3;
          local_50.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[0];
          bVar7 = (session->sessionId).identifier.guid.data4[1];
          bVar6 = (session->sessionId).identifier.guid.data4[2];
          bVar5 = (session->sessionId).identifier.guid.data4[3];
          bVar1 = (session->sessionId).identifier.guid.data4[4];
          bVar4 = (session->sessionId).identifier.guid.data4[5];
          bVar3 = (session->sessionId).identifier.guid.data4[6];
          bVar2 = (session->sessionId).identifier.guid.data4[7];
          pcVar22 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node need to have a HasSubType reference"
          ;
          goto LAB_001207b7;
        }
        if ((pUVar12->node).nodeClass != UVar9) {
          p_Var24 = (server->config).logger;
          pUVar11 = session->channel;
          if (pUVar11 == (UA_SecureChannel *)0x0) {
            uVar21 = 0;
            uVar25 = 0;
          }
          else {
            if (pUVar11->connection == (UA_Connection *)0x0) {
              uVar21 = 0;
            }
            else {
              uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
            }
            uVar25 = (ulong)(pUVar11->securityToken).channelId;
          }
          uVar10 = (session->sessionId).identifier.numeric;
          local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
          uVar8 = (session->sessionId).identifier.guid.data3;
          local_50.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[0];
          bVar1 = (session->sessionId).identifier.guid.data4[1];
          bVar2 = (session->sessionId).identifier.guid.data4[2];
          bVar3 = (session->sessionId).identifier.guid.data4[3];
          bVar4 = (session->sessionId).identifier.guid.data4[4];
          bVar5 = (session->sessionId).identifier.guid.data4[5];
          bVar6 = (session->sessionId).identifier.guid.data4[6];
          bVar7 = (session->sessionId).identifier.guid.data4[7];
          pcVar22 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node needs to be of the same node type as the parent"
          ;
          goto LAB_001201d6;
        }
      }
      else {
        local_b0._0_2_ = 0;
        stack0xffffffffffffff54 = 0x2100000000;
        UVar17 = isNodeInTree(ns,referenceTypeId,(UA_NodeId *)local_b0,(UA_NodeId *)auStack_138,1);
        if (!UVar17) {
          p_Var24 = (server->config).logger;
          pUVar11 = session->channel;
          if (pUVar11 == (UA_SecureChannel *)0x0) {
            uVar21 = 0;
            uVar25 = 0;
          }
          else {
            if (pUVar11->connection == (UA_Connection *)0x0) {
              uVar21 = 0;
            }
            else {
              uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
            }
            uVar25 = (ulong)(pUVar11->securityToken).channelId;
          }
          uVar26 = (ulong)(session->sessionId).identifier.numeric;
          local_40.lh_first = (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data2;
          local_38 = (UA_PublishResponseEntry *)(ulong)(session->sessionId).identifier.guid.data3;
          local_50.lh_first =
               (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[0];
          local_48 = (ulong)(session->sessionId).identifier.guid.data4[1];
          uVar29 = (ulong)(session->sessionId).identifier.guid.data4[2];
          uVar30 = (ulong)(session->sessionId).identifier.guid.data4[3];
          uVar27 = (ulong)(session->sessionId).identifier.guid.data4[4];
          uVar28 = (ulong)(session->sessionId).identifier.guid.data4[5];
          uVar23 = (ulong)(session->sessionId).identifier.guid.data4[6];
          uVar32 = (ulong)(session->sessionId).identifier.guid.data4[7];
          pcVar22 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type is not hierarchical"
          ;
          goto LAB_0012035f;
        }
      }
LAB_0011fe97:
      UVar18 = UA_NodeStore_insert(ns,node);
      if (UVar18 != 0) {
        pUVar11 = session->channel;
        if (pUVar11 == (UA_SecureChannel *)0x0) {
          uVar21 = 0;
          uVar25 = 0;
        }
        else {
          if (pUVar11->connection == (UA_Connection *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
          }
          uVar25 = (ulong)(pUVar11->securityToken).channelId;
        }
        lVar20 = 0;
        lVar31 = 0x141ba0;
        do {
          if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar20) == UVar18) {
            lVar31 = (long)&statusCodeDescriptions[0].code + lVar20;
            break;
          }
          lVar20 = lVar20 + 0x18;
        } while (lVar20 != 0x1578);
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Node could not be added to the nodestore with error code %s"
                    ,uVar21,uVar25,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar31 + 8)
                   );
        return UVar18;
      }
      if ((addedNodeId != (UA_NodeId *)0x0) &&
         (UVar18 = UA_copy(node,addedNodeId,UA_TYPES + 0x10), UVar18 != 0)) {
        pUVar11 = session->channel;
        if (pUVar11 == (UA_SecureChannel *)0x0) {
          uVar21 = 0;
          uVar25 = 0;
        }
        else {
          if (pUVar11->connection == (UA_Connection *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
          }
          uVar25 = (ulong)(pUVar11->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not copy the nodeid"
                    ,uVar21,uVar25,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        deleteReferences = (undefined1)uVar21;
        goto LAB_00120c48;
      }
      UVar17 = UA_NodeId_isNull(parentNodeId);
      if (UVar17) {
LAB_00120470:
        id_1.identifier._8_2_ = 0;
        stack0xffffffffffffff6c = 0x3f00000000;
        basedatavariabletype.identifier._8_2_ = 0;
        stack0xffffffffffffff84 = 0x3a00000000;
        UVar9 = node->nodeClass;
        local_38 = (UA_PublishResponseEntry *)typeDefinition;
        if (1 < UVar9 - UA_NODECLASS_OBJECT) {
LAB_001206ef:
          if (instantiationCallback == (UA_InstantiationCallback *)0x0) {
            return 0;
          }
          (*instantiationCallback->method)
                    (node->nodeId,*(UA_NodeId *)local_38,instantiationCallback->handle);
          return 0;
        }
        if ((typeDefinition == (UA_NodeId *)0x0) ||
           (UVar17 = UA_NodeId_isNull(typeDefinition), UVar17)) {
          local_38 = (UA_PublishResponseEntry *)((long)&basedatavariabletype.identifier + 8);
          if (UVar9 == UA_NODECLASS_VARIABLE) {
            local_38 = (UA_PublishResponseEntry *)((long)&id_1.identifier + 8);
          }
        }
        UVar18 = instantiateNode(server,session,&node->nodeId,UVar9,(UA_NodeId *)local_38,
                                 instantiationCallback);
        if (UVar18 == 0) goto LAB_001206ef;
        pUVar11 = session->channel;
        if (pUVar11 == (UA_SecureChannel *)0x0) {
          uVar21 = 0;
          uVar25 = 0;
        }
        else {
          if (pUVar11->connection == (UA_Connection *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
          }
          uVar25 = (ulong)(pUVar11->securityToken).channelId;
        }
        p_Var24 = (server->config).logger;
        uVar10 = (session->sessionId).identifier.numeric;
        local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
        uVar8 = (session->sessionId).identifier.guid.data3;
        bVar1 = (session->sessionId).identifier.guid.data4[0];
        baseobjecttype.identifier.guid.data4[0] = (session->sessionId).identifier.guid.data4[1];
        bVar2 = (session->sessionId).identifier.guid.data4[2];
        bVar3 = (session->sessionId).identifier.guid.data4[3];
        bVar4 = (session->sessionId).identifier.guid.data4[4];
        bVar5 = (session->sessionId).identifier.guid.data4[5];
        bVar6 = (session->sessionId).identifier.guid.data4[6];
        bVar7 = (session->sessionId).identifier.guid.data4[7];
        lVar31 = 0;
        lVar20 = 0x141ba0;
        do {
          if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar31) == UVar18) {
            lVar20 = (long)&statusCodeDescriptions[0].code + lVar31;
            break;
          }
          lVar31 = lVar31 + 0x18;
        } while (lVar31 != 0x1578);
        pcVar22 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not instantiate the node witherror code %s"
        ;
      }
      else {
        subtypeId.identifier.string.length = (size_t)(node->nodeId).identifier.string.data;
        uVar13 = (node->nodeId).namespaceIndex;
        uVar14 = *(undefined2 *)&(node->nodeId).field_0x2;
        uVar15 = (node->nodeId).identifierType;
        sVar16 = (node->nodeId).identifier.string.length;
        subtypeId._0_4_ = SUB84(sVar16,0);
        subtypeId.identifierType = (UA_NodeIdType)(sVar16 >> 0x20);
        subtypeId.identifier.string.data = (UA_Byte *)*(undefined8 *)referenceTypeId;
        auStack_138._0_2_ = uVar13;
        auStack_138._2_2_ = uVar14;
        auStack_138._4_4_ = uVar15;
        UVar18 = addReference(server,(UA_Session *)auStack_138,item);
        if (UVar18 == 0) goto LAB_00120470;
        pUVar11 = session->channel;
        if (pUVar11 == (UA_SecureChannel *)0x0) {
          uVar21 = 0;
          uVar25 = 0;
        }
        else {
          if (pUVar11->connection == (UA_Connection *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
          }
          uVar25 = (ulong)(pUVar11->securityToken).channelId;
        }
        p_Var24 = (server->config).logger;
        uVar10 = (session->sessionId).identifier.numeric;
        local_40.lh_first._0_2_ = (session->sessionId).identifier.guid.data2;
        uVar8 = (session->sessionId).identifier.guid.data3;
        bVar1 = (session->sessionId).identifier.guid.data4[0];
        baseobjecttype.identifier.guid.data4[0] = (session->sessionId).identifier.guid.data4[1];
        bVar2 = (session->sessionId).identifier.guid.data4[2];
        bVar3 = (session->sessionId).identifier.guid.data4[3];
        bVar4 = (session->sessionId).identifier.guid.data4[4];
        bVar5 = (session->sessionId).identifier.guid.data4[5];
        bVar6 = (session->sessionId).identifier.guid.data4[6];
        bVar7 = (session->sessionId).identifier.guid.data4[7];
        lVar31 = 0;
        lVar20 = 0x141ba0;
        do {
          if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar31) == UVar18) {
            lVar20 = (long)&statusCodeDescriptions[0].code + lVar31;
            break;
          }
          lVar31 = lVar31 + 0x18;
        } while (lVar31 != 0x1578);
        pcVar22 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not add the reference to the parentwith error code %s"
        ;
      }
      local_38 = (UA_PublishResponseEntry *)(ulong)uVar8;
      local_40.lh_first._2_6_ = 0;
      local_48 = (ulong)bVar1;
      baseobjecttype.identifier._9_7_ = 0;
      UA_LOG_INFO(p_Var24,UA_LOGCATEGORY_SESSION,pcVar22,uVar21,uVar25,(ulong)uVar10,
                  local_40.lh_first,local_38,local_48,baseobjecttype.identifier.string.data,
                  (ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,
                  *(undefined8 *)(lVar20 + 8));
      deleteReferences = (undefined1)uVar21;
LAB_00120c48:
      deleteNode(server,(UA_Session *)node,(UA_NodeId *)0x1,(UA_Boolean)deleteReferences);
      return UVar18;
    }
    p_Var24 = (server->config).logger;
    pUVar11 = session->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    uVar26 = (ulong)(session->sessionId).identifier.numeric;
    local_40.lh_first = (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data2;
    local_38 = (UA_PublishResponseEntry *)(ulong)(session->sessionId).identifier.guid.data3;
    local_50.lh_first =
         (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[0];
    local_48 = (ulong)(session->sessionId).identifier.guid.data4[1];
    uVar29 = (ulong)(session->sessionId).identifier.guid.data4[2];
    uVar30 = (ulong)(session->sessionId).identifier.guid.data4[3];
    uVar27 = (ulong)(session->sessionId).identifier.guid.data4[4];
    uVar28 = (ulong)(session->sessionId).identifier.guid.data4[5];
    uVar23 = (ulong)(session->sessionId).identifier.guid.data4[6];
    uVar32 = (ulong)(session->sessionId).identifier.guid.data4[7];
    pcVar22 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent invalid"
    ;
  }
LAB_0012035f:
  UA_LOG_INFO(p_Var24,UA_LOGCATEGORY_SESSION,pcVar22,uVar21,uVar25,uVar26,local_40.lh_first,local_38
              ,local_50.lh_first,local_48,uVar29,uVar30,uVar27,uVar28,uVar23,uVar32);
  UVar18 = 0x804c0000;
LAB_001207e4:
  pUVar11 = session->channel;
  if (pUVar11 == (UA_SecureChannel *)0x0) {
    uVar21 = 0;
    uVar25 = 0;
  }
  else {
    if (pUVar11->connection == (UA_Connection *)0x0) {
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
    }
    uVar25 = (ulong)(pUVar11->securityToken).channelId;
  }
  lVar20 = 0;
  lVar31 = 0x141ba0;
  do {
    if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar20) == UVar18) {
      lVar31 = (long)&statusCodeDescriptions[0].code + lVar20;
      break;
    }
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x1578);
  UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Checking the reference to the parent returned error code %s"
              ,uVar21,uVar25,(ulong)(session->sessionId).identifier.numeric,
              (ulong)(session->sessionId).identifier.guid.data2,
              (ulong)(session->sessionId).identifier.guid.data3,
              (ulong)(session->sessionId).identifier.guid.data4[0],
              (ulong)(session->sessionId).identifier.guid.data4[1],
              (ulong)(session->sessionId).identifier.guid.data4[2],
              (ulong)(session->sessionId).identifier.guid.data4[3],
              (ulong)(session->sessionId).identifier.guid.data4[4],
              (ulong)(session->sessionId).identifier.guid.data4[5],
              (ulong)(session->sessionId).identifier.guid.data4[6],
              (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar31 + 8));
  UA_NodeStore_deleteNode(node);
  return UVar18;
}

Assistant:

UA_StatusCode
Service_AddNodes_existing(UA_Server *server, UA_Session *session, UA_Node *node,
                          const UA_NodeId *parentNodeId, const UA_NodeId *referenceTypeId,
                          const UA_NodeId *typeDefinition,
                          UA_InstantiationCallback *instantiationCallback,
                          UA_NodeId *addedNodeId) {
    UA_ASSERT_RCU_LOCKED();

    /* Check the namespaceindex */
    if(node->nodeId.namespaceIndex >= server->namespacesSize) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "AddNodes: Namespace invalid");
        UA_NodeStore_deleteNode(node);
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* Check the reference to the parent */
    UA_StatusCode retval = checkParentReference(server, session, node->nodeClass,
                                                parentNodeId, referenceTypeId);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Checking the reference to the parent returned "
                            "error code %s", UA_StatusCode_name(retval));
        UA_NodeStore_deleteNode(node);
        return retval;
    }

    /* Add the node to the nodestore */
    retval = UA_NodeStore_insert(server->nodestore, node);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Node could not be added to the nodestore "
                            "with error code %s", UA_StatusCode_name(retval));
        return retval;
    }

    /* Copy the nodeid if needed */
    if(addedNodeId) {
        retval = UA_NodeId_copy(&node->nodeId, addedNodeId);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not copy the nodeid");
            goto remove_node;
        }
    }

    /* Hierarchical reference back to the parent */
    if(!UA_NodeId_isNull(parentNodeId)) {
        UA_AddReferencesItem item;
        UA_AddReferencesItem_init(&item);
        item.sourceNodeId = node->nodeId;
        item.referenceTypeId = *referenceTypeId;
        item.isForward = false;
        item.targetNodeId.nodeId = *parentNodeId;
        retval = addReference(server, session, &item);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not add the reference to the parent"
                                "with error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Fall back to a default typedefinition for variables and objects */
    const UA_NodeId basedatavariabletype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEDATAVARIABLETYPE);
    const UA_NodeId baseobjecttype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEOBJECTTYPE);
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        if(!typeDefinition || UA_NodeId_isNull(typeDefinition)) {
            if(node->nodeClass == UA_NODECLASS_VARIABLE)
                typeDefinition = &basedatavariabletype;
            else
                typeDefinition = &baseobjecttype;
        }

        /* Instantiate variables and objects */
        retval = instantiateNode(server, session, &node->nodeId, node->nodeClass,
                                 typeDefinition, instantiationCallback);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not instantiate the node with"
                                "error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Custom callback */
    if(instantiationCallback)
        instantiationCallback->method(node->nodeId, *typeDefinition,
                                      instantiationCallback->handle);
    return UA_STATUSCODE_GOOD;

 remove_node:
    deleteNode(server, &adminSession, &node->nodeId, true);
    return retval;
}